

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O2

int lls_svd2(double *Ai,double *bi,int M,int N,double *xo)

{
  long lVar1;
  size_t __size;
  long lVar2;
  double *AB;
  double *q;
  double *B;
  double *A;
  ulong uVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  iVar5 = N;
  if (N < M) {
    iVar5 = M;
  }
  lVar2 = (long)N;
  lVar1 = lVar2 + 1;
  uVar9 = 0;
  dVar10 = macheps();
  AB = (double *)malloc(iVar5 * lVar1 * 8);
  __size = lVar2 * 8;
  q = (double *)malloc(__size);
  B = (double *)malloc(__size);
  A = (double *)malloc(__size * lVar2);
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  uVar3 = 0;
  pdVar4 = AB;
  if (0 < M) {
    uVar3 = (ulong)(uint)M;
  }
  for (; uVar9 != uVar3; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pdVar4[uVar8] = Ai[uVar8];
    }
    Ai = Ai + lVar2;
    pdVar4 = pdVar4 + lVar2 + 1;
  }
  pdVar4 = AB + lVar2;
  for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    *pdVar4 = bi[uVar9];
    pdVar4 = pdVar4 + lVar1;
  }
  minfit(AB,M,N,1,q);
  pdVar4 = AB;
  pdVar7 = A;
  for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    for (uVar3 = 0; (uint)N != uVar3; uVar3 = uVar3 + 1) {
      pdVar7[uVar3] = pdVar4[uVar3];
    }
    pdVar7 = pdVar7 + lVar2;
    pdVar4 = pdVar4 + lVar1;
  }
  pdVar4 = A;
  for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    for (uVar3 = 0; (uint)N != uVar3; uVar3 = uVar3 + 1) {
      if (ABS(q[uVar3]) <= dVar10) {
        pdVar4[uVar3] = 0.0;
      }
      else {
        pdVar4[uVar3] = pdVar4[uVar3] / q[uVar3];
      }
    }
    pdVar4 = pdVar4 + lVar2;
  }
  pdVar4 = AB + lVar2;
  for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    B[uVar9] = *pdVar4;
    pdVar4 = pdVar4 + lVar1;
  }
  mmult(A,B,xo,N,N,1);
  free(AB);
  free(q);
  free(A);
  free(B);
  return 0;
}

Assistant:

int lls_svd2(double *Ai,double *bi,int M,int N,double *xo) {
	int retcode,P,mnmax,np,i,j,t,t2;
	double *AB,*q,*V,*C;
	double eps;

	if (M > N) {
		mnmax = M;
	} else {
		mnmax = N;
	}
	retcode = 0;
	P = 1;
	np = N + P;
	eps = macheps();

	AB = (double*) malloc(sizeof(double) * mnmax * np);
	q = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N);
	V = (double*) malloc(sizeof(double) * N * N);

	for(i = 0; i < M;++i) {
		t = i * N;
		t2 = i * np;
		for(j = 0; j < N;++j) {
			AB[t2 + j] = Ai[t+j];
		}
	}

	for(i = 0; i < M;++i) {
		t2 = i * np;
		AB[t2+N] = bi[i];
	}

	minfit(AB,M,N,P,q);

	for(i = 0; i < N;++i) {
		t = i * N;
		t2 = i * np;
		for(j = 0; j < N;++j) {
			V[t+j] = AB[t2 + j];
		}
	}

	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (fabs(q[j]) > eps) {
				V[t+j] /= q[j];
			} else {
				V[t+j] = 0.0;
			}
		}
	}

	for(i = 0; i < N;++i) {
		t2 = i * np;
		C[i] = AB[t2+N];
	}
	mmult(V,C,xo,N,N,1);

	free(AB);
	free(q);
	free(V);
	free(C);
	return retcode;
}